

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

void __thiscall cfd::core::Serializer::AddVariableBuffer(Serializer *this,ByteData *buffer)

{
  uint uVar1;
  size_type sVar2;
  CfdException *this_00;
  uchar *buffer_00;
  allocator local_79;
  string local_78;
  CfdSourceLocation local_48;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  ByteData *buffer_local;
  Serializer *this_local;
  
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)buffer;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,buffer);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  uVar1 = ::std::numeric_limits<unsigned_int>::max();
  if (uVar1 < sVar2) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_bytedata.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0x184;
    local_48.funcname = "AddVariableBuffer";
    logger::warn<>(&local_48,"It exceeds the handling size.");
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_78,"It exceeds the handling size.",&local_79);
    CfdException::CfdException(this_00,kCfdIllegalStateError,&local_78);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  buffer_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  AddVariableBuffer(this,buffer_00,(uint32_t)sVar2);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return;
}

Assistant:

void Serializer::AddVariableBuffer(const ByteData& buffer) {
  auto buf = buffer.GetBytes();
  if (buf.size() > std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "It exceeds the handling size.");
    throw CfdException(kCfdIllegalStateError, "It exceeds the handling size.");
  }
  AddVariableBuffer(buf.data(), static_cast<uint32_t>(buf.size()));
}